

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::ModelDescription::ByteSizeLong(ModelDescription *this)

{
  bool bVar1;
  int iVar2;
  reference value;
  reference pFVar3;
  ulong uVar4;
  string *psVar5;
  size_t sVar6;
  long lVar7;
  int cached_size;
  FeatureDescription *msg_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2_4;
  FunctionDescription *msg_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  RepeatedPtrField<CoreML::Specification::FunctionDescription> *__range2_3;
  FeatureDescription *msg_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2_2;
  FeatureDescription *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2_1;
  FeatureDescription *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  ModelDescription *this_local;
  
  iVar2 = _internal_input_size(this);
  sStack_18 = (size_t)iVar2;
  __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (&this->input_);
  msg = (FeatureDescription *)
        google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                  (&this->input_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end2,(iterator *)&msg), bVar1) {
    pFVar3 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end2);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::FeatureDescription>(pFVar3);
    sStack_18 = sVar6 + sStack_18;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end2);
  }
  iVar2 = _internal_output_size(this);
  sStack_18 = (long)iVar2 + sStack_18;
  __end2_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (&this->output_);
  msg_1 = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                    (&this->output_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end2_1,(iterator *)&msg_1), bVar1) {
    pFVar3 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end2_1);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::FeatureDescription>(pFVar3);
    sStack_18 = sVar6 + sStack_18;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end2_1);
  }
  iVar2 = _internal_state_size(this);
  sStack_18 = (long)iVar2 + sStack_18;
  __end2_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (&this->state_);
  msg_2 = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                    (&this->state_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end2_2,(iterator *)&msg_2), bVar1) {
    pFVar3 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end2_2);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::FeatureDescription>(pFVar3);
    sStack_18 = sVar6 + sStack_18;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end2_2);
  }
  iVar2 = _internal_functions_size(this);
  sStack_18 = (long)iVar2 * 2 + sStack_18;
  __end2_3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FunctionDescription>::begin
                       (&this->functions_);
  msg_3 = (FunctionDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FunctionDescription>::end
                    (&this->functions_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FunctionDescription>::operator!=
                           (&__end2_3,(iterator *)&msg_3), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::FunctionDescription>::operator*
                      (&__end2_3);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::FunctionDescription>(value);
    sStack_18 = sVar6 + sStack_18;
    google::protobuf::internal::
    RepeatedPtrIterator<const_CoreML::Specification::FunctionDescription>::operator++(&__end2_3);
  }
  iVar2 = _internal_traininginput_size(this);
  sStack_18 = (long)iVar2 * 2 + sStack_18;
  __end2_4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (&this->traininginput_);
  msg_4 = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                    (&this->traininginput_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end2_4,(iterator *)&msg_4), bVar1) {
    pFVar3 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end2_4);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::FeatureDescription>(pFVar3);
    sStack_18 = sVar6 + sStack_18;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end2_4);
  }
  _internal_predictedfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_predictedfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  _internal_predictedprobabilitiesname_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_predictedprobabilitiesname_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  _internal_defaultfunctionname_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_defaultfunctionname_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  bVar1 = _internal_has_metadata(this);
  if (bVar1) {
    sVar6 = google::protobuf::internal::WireFormatLite::MessageSize<CoreML::Specification::Metadata>
                      (this->metadata_);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar7 = std::__cxx11::string::size();
    sStack_18 = lVar7 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t ModelDescription::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ModelDescription)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.FeatureDescription input = 1;
  total_size += 1UL * this->_internal_input_size();
  for (const auto& msg : this->input_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FeatureDescription output = 10;
  total_size += 1UL * this->_internal_output_size();
  for (const auto& msg : this->output_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FeatureDescription state = 13;
  total_size += 1UL * this->_internal_state_size();
  for (const auto& msg : this->state_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FunctionDescription functions = 20;
  total_size += 2UL * this->_internal_functions_size();
  for (const auto& msg : this->functions_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.FeatureDescription trainingInput = 50;
  total_size += 2UL * this->_internal_traininginput_size();
  for (const auto& msg : this->traininginput_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string predictedFeatureName = 11;
  if (!this->_internal_predictedfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_predictedfeaturename());
  }

  // string predictedProbabilitiesName = 12;
  if (!this->_internal_predictedprobabilitiesname().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_predictedprobabilitiesname());
  }

  // string defaultFunctionName = 21;
  if (!this->_internal_defaultfunctionname().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_defaultfunctionname());
  }

  // .CoreML.Specification.Metadata metadata = 100;
  if (this->_internal_has_metadata()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *metadata_);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}